

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayOperations.cc
# Opt level: O3

int normaliseArray(double *inputVector,uint *outputVector,int vectorLength)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  int i_1;
  int iVar4;
  int iVar5;
  int i;
  ulong uVar6;
  ulong __nmemb;
  double dVar7;
  
  if (vectorLength < 1) {
    iVar5 = 0;
  }
  else {
    __nmemb = (ulong)(uint)vectorLength;
    __ptr = calloc(__nmemb,4);
    dVar7 = floor(*inputVector);
    iVar4 = (int)dVar7;
    uVar6 = 0;
    iVar5 = iVar4;
    do {
      dVar7 = floor(inputVector[uVar6]);
      iVar2 = (int)dVar7;
      iVar1 = iVar2;
      if (iVar2 < iVar4) {
        iVar1 = iVar4;
      }
      *(int *)((long)__ptr + uVar6 * 4) = iVar2;
      iVar3 = iVar2;
      if (iVar5 < iVar2) {
        iVar3 = iVar5;
      }
      if (iVar2 < iVar5) {
        iVar1 = iVar4;
      }
      iVar4 = iVar1;
      uVar6 = uVar6 + 1;
      iVar5 = iVar3;
    } while (__nmemb != uVar6);
    uVar6 = 0;
    do {
      outputVector[uVar6] = *(int *)((long)__ptr + uVar6 * 4) - iVar3;
      uVar6 = uVar6 + 1;
    } while (__nmemb != uVar6);
    iVar5 = (iVar4 - iVar3) + 1;
    free(__ptr);
  }
  return iVar5;
}

Assistant:

int normaliseArray(double *inputVector, uint *outputVector, int vectorLength) {
    int maxVal = 0;

    if (vectorLength > 0) {
        int* tempVector = (int*) calloc(vectorLength,sizeof(int));
        int minVal = (int) floor(inputVector[0]);
        maxVal = (int) floor(inputVector[0]);

        for (int i = 0; i < vectorLength; i++) {
            int currentValue = (int) floor(inputVector[i]);
            tempVector[i] = currentValue;

            if (currentValue < minVal) {
                minVal = currentValue;
            } else if (currentValue > maxVal) {
                maxVal = currentValue;
            }
        }/*for loop over vector*/

        for (int i = 0; i < vectorLength; i++) {
            outputVector[i] = tempVector[i] - minVal;
        }

        maxVal = (maxVal - minVal) + 1;

        free(tempVector);
        
    }

    return maxVal;
}